

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O0

void update_address(MemoryDescr *rmd,MemoryDescr *dmd,unsigned_long addbytes)

{
  long in_RDX;
  long in_RSI;
  long in_RDI;
  char *secname;
  char *local_28;
  
  if (current_ls == (LinkedSection *)0x0) {
    local_28 = defmemname;
  }
  else {
    local_28 = current_ls->name;
  }
  *(long *)(in_RDI + 0x20) = in_RDX + *(long *)(in_RDI + 0x20);
  if (*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0x18) < *(long *)(in_RDI + 0x20)) {
    error(0x3f,*(undefined8 *)(in_RDI + 8),local_28,*(undefined8 *)(in_RDI + 0x20));
  }
  if ((in_RSI != in_RDI) &&
     (*(long *)(in_RSI + 0x20) = in_RDX + *(long *)(in_RSI + 0x20),
     *(long *)(in_RSI + 0x10) + *(long *)(in_RSI + 0x18) < *(long *)(in_RSI + 0x20))) {
    error(0x3f,*(undefined8 *)(in_RSI + 8),local_28,*(undefined8 *)(in_RSI + 0x20));
  }
  return;
}

Assistant:

void update_address(struct MemoryDescr *rmd,struct MemoryDescr *dmd,
                    unsigned long addbytes)
{
  const char *secname = current_ls ? current_ls->name : defmemname;

  rmd->current += (lword)addbytes;
  if (rmd->current > rmd->org + rmd->len) {
    /* Fatal: Size of memory region exceeded! */
    error(63,rmd->name,secname,rmd->current);
  }
  if (dmd != rmd) {
    dmd->current += addbytes;
    if (dmd->current > dmd->org + dmd->len) {
      /* Fatal: Size of memory region exceeded! */
      error(63,dmd->name,secname,dmd->current);
    }
  }
}